

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_CheckInventory(FParser *this)

{
  AActor *activator;
  bool bVar1;
  int iVar2;
  char *type;
  int playernum;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    iVar2 = T_GetPlayerNum(this->t_argv);
    if (iVar2 == -1) {
      (this->t_return).value.i = 0;
    }
    else {
      (this->t_return).type = 1;
      activator = (AActor *)(&players)[(long)iVar2 * 0x54];
      type = stringvalue(this->t_argv + 1);
      iVar2 = FS_CheckInventory(activator,type);
      (this->t_return).value.i = iVar2;
    }
  }
  return;
}

Assistant:

void FParser::SF_CheckInventory(void)
{
	int  playernum;
	
	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) 
		{
			t_return.value.i = 0;
			return;
		}
		t_return.type = svt_int;
		t_return.value.i = FS_CheckInventory(players[playernum].mo, stringvalue(t_argv[1]));
	}
}